

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::pls_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,PlsRemap *var)

{
  uint uVar1;
  SPIRVariable *pSVar2;
  mapped_type *pmVar3;
  uint uVar4;
  undefined4 uVar5;
  uint uVar6;
  ID *__k;
  SPIRType type;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  char *local_1a0 [2];
  char local_190 [16];
  undefined **local_180;
  undefined4 local_178;
  ulong local_174;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined1 *local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined1 local_148 [32];
  undefined1 *local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined1 local_110 [8];
  undefined4 local_108;
  undefined2 local_104;
  undefined4 local_100;
  undefined1 *local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined1 local_e0 [32];
  undefined1 *local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined1 local_a8 [32];
  undefined4 local_88;
  undefined8 local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  pSVar2 = Variant::get<spirv_cross::SPIRVariable>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      var->id);
  local_178 = 0;
  local_180 = &PTR__SPIRType_0035b448;
  uStack_158 = 0;
  local_150 = 8;
  uStack_120 = 0;
  local_118 = 8;
  local_108 = 0;
  local_104 = 0;
  local_100 = 8;
  local_f8 = local_e0;
  uStack_f0 = 0;
  local_e8 = 8;
  uStack_b8 = 0;
  local_b0 = 8;
  local_88 = 0;
  local_70 = 0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  uVar1 = var->format - PlsR11FG11FB10F;
  uVar5 = 1;
  if (uVar1 < 0xb) {
    uVar5 = *(undefined4 *)(&DAT_002dd4d4 + (ulong)uVar1 * 4);
  }
  _uStack_16c = CONCAT44(1,uVar5);
  uVar4 = var->format - PlsRGBA8I;
  uVar6 = 0xd;
  if (uVar4 < 6) {
    uVar6 = *(uint *)(&DAT_002dd474 + (ulong)uVar4 * 4);
  }
  local_174 = (ulong)uVar6;
  if (uVar1 < 0xc) {
    local_1c8 = &DAT_002dd48c + *(int *)(&DAT_002dd48c + (ulong)uVar1 * 4);
  }
  else {
    local_1c8 = "";
  }
  __k = &(pSVar2->super_IVariant).self;
  local_160 = local_148;
  local_128 = local_110;
  local_c0 = local_a8;
  pmVar3 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_Compiler).ir.meta,__k);
  local_1d0 = "mediump ";
  if (((pmVar3->decoration).decoration_flags.lower & 1) == 0) {
    local_1d0 = "highp ";
  }
  (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1a0,this,&local_180,0);
  (*(this->super_Compiler)._vptr_Compiler[6])(local_1c0,this,(ulong)__k->id,1);
  join<char_const*,char_const*,std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            (__return_storage_ptr__,(spirv_cross *)&local_1c8,&local_1d0,local_1a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e46c1,
             (char (*) [2])local_1c0,__return_storage_ptr__);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0]);
  }
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0]);
  }
  local_180 = &PTR__SPIRType_0035b448;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  uStack_b8 = 0;
  if (local_c0 != local_a8) {
    free(local_c0);
  }
  uStack_f0 = 0;
  if (local_f8 != local_e0) {
    free(local_f8);
  }
  uStack_120 = 0;
  if (local_128 != local_110) {
    free(local_128);
  }
  uStack_158 = 0;
  if (local_160 != local_148) {
    free(local_160);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::pls_decl(const PlsRemap &var)
{
	auto &variable = get<SPIRVariable>(var.id);

	SPIRType type;
	type.vecsize = pls_format_to_components(var.format);
	type.basetype = pls_format_to_basetype(var.format);

	return join(to_pls_layout(var.format), to_pls_qualifiers_glsl(variable), type_to_glsl(type), " ",
	            to_name(variable.self));
}